

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_1,_false,_embree::sse2::SubGridIntersector1Moeller<4,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [14];
  unkuint10 Var18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [12];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [13];
  undefined1 auVar35 [11];
  undefined1 auVar36 [13];
  undefined1 auVar37 [11];
  undefined1 auVar38 [13];
  undefined1 auVar39 [11];
  undefined1 auVar40 [13];
  undefined1 auVar41 [11];
  undefined1 auVar42 [13];
  undefined1 auVar43 [11];
  undefined1 auVar44 [13];
  undefined1 auVar45 [11];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  uint6 uVar54;
  uint6 uVar55;
  uint6 uVar56;
  uint6 uVar57;
  uint6 uVar58;
  uint6 uVar59;
  undefined1 (*pauVar60) [16];
  undefined4 uVar61;
  long lVar62;
  Scene *pSVar63;
  RayHit *pRVar64;
  int iVar65;
  int iVar66;
  ulong uVar67;
  RTCRayQueryContext *pRVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  Geometry *pGVar72;
  RTCIntersectArguments *pRVar73;
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  byte bVar83;
  char cVar84;
  float fVar85;
  byte bVar110;
  byte bVar112;
  char cVar115;
  float fVar116;
  char cVar117;
  char cVar118;
  float fVar121;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  char cVar111;
  char cVar113;
  char cVar114;
  byte bVar120;
  undefined1 auVar92 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  float fVar122;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar123;
  float fVar140;
  float fVar142;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  ushort uVar141;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar143;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar144;
  float fVar156;
  float fVar158;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  ushort uVar157;
  undefined1 auVar152 [16];
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar160;
  float fVar179;
  float fVar183;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  ushort uVar181;
  undefined1 auVar168 [16];
  ushort uVar182;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar180;
  uint uVar184;
  float fVar185;
  uint uVar186;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar187;
  float fVar192;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar193;
  float fVar194;
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  ushort uVar202;
  undefined1 auVar199 [16];
  float fVar205;
  float fVar206;
  float fVar211;
  undefined1 auVar207 [16];
  ushort uVar212;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar219;
  undefined1 auVar218 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12d4 [16];
  undefined1 auStack_12c4 [12];
  RTCFilterFunctionNArguments local_12b8;
  undefined8 local_1288;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float local_1254;
  undefined4 local_1250;
  float local_124c;
  float local_1248;
  uint local_1244;
  undefined4 local_1240;
  uint local_123c;
  uint local_1238;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  Geometry *local_1210;
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [16];
  undefined1 local_11b8 [16];
  float local_11a8 [4];
  float local_1198 [4];
  float local_1188 [4];
  undefined8 local_1178;
  undefined8 uStack_1170;
  float local_1168 [4];
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  undefined8 local_1138;
  float fStack_1130;
  float fStack_112c;
  uint local_1128;
  uint uStack_1124;
  uint uStack_1120;
  uint uStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [8];
  float fStack_1100;
  float fStack_10fc;
  undefined8 local_10f8;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  ulong local_10b0;
  ulong local_10a8;
  ulong local_10a0;
  ulong local_1098;
  undefined1 (*local_1090) [16];
  ulong local_1088;
  ulong local_1080;
  ulong local_1078;
  ulong local_1070;
  ulong local_1068;
  ulong local_1060;
  ulong local_1058;
  long local_1050;
  ulong local_1048;
  ulong local_1040;
  long local_1038;
  ulong local_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined8 local_fb8;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar93 [16];
  undefined1 auVar86 [11];
  undefined1 auVar94 [16];
  undefined1 auVar100 [16];
  undefined1 auVar87 [12];
  undefined1 auVar95 [16];
  undefined1 auVar88 [13];
  undefined1 auVar96 [16];
  undefined1 auVar101 [16];
  undefined1 auVar98 [16];
  undefined1 auVar97 [16];
  undefined2 uVar119;
  undefined1 auVar129 [16];
  undefined1 auVar151 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar198 [16];
  undefined1 auVar208 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1090 = (undefined1 (*) [16])local_f68;
      local_fe8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_ff8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1118 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar144 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar232 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar140 = (ray->super_RayK<1>).dir.field_0.m128[2];
      fVar233 = (ray->super_RayK<1>).dir.field_0.m128[3];
      fVar179 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar123 = 0.0;
      if (0.0 <= fVar179) {
        fVar123 = fVar179;
      }
      fVar179 = (ray->super_RayK<1>).tfar;
      fVar143 = 0.0;
      if (0.0 <= fVar179) {
        fVar143 = fVar179;
      }
      uVar79 = -(uint)(1e-18 <= ABS(fVar144));
      uVar80 = -(uint)(1e-18 <= ABS(fVar232));
      uVar81 = -(uint)(1e-18 <= ABS(fVar140));
      uVar82 = -(uint)(1e-18 <= ABS(fVar233));
      auVar124._0_4_ = (uint)fVar144 & uVar79;
      auVar124._4_4_ = (uint)fVar232 & uVar80;
      auVar124._8_4_ = (uint)fVar140 & uVar81;
      auVar124._12_4_ = (uint)fVar233 & uVar82;
      auVar145._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x219392ef219392ef;
      auVar145._8_4_ = ~uVar81 & 0x219392ef;
      auVar145._12_4_ = ~uVar82 & 0x219392ef;
      auVar145 = auVar145 | auVar124;
      auVar124 = rcpps(auVar124,auVar145);
      local_1008 = auVar124._0_4_;
      fVar179 = auVar124._4_4_;
      fVar144 = auVar124._8_4_;
      local_1008 = (1.0 - auVar145._0_4_ * local_1008) * local_1008 + local_1008;
      fVar179 = (1.0 - auVar145._4_4_ * fVar179) * fVar179 + fVar179;
      local_fd8._8_4_ = (1.0 - auVar145._8_4_ * fVar144) * fVar144 + fVar144;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      local_1018._4_4_ = fVar179;
      local_1018._0_4_ = fVar179;
      fStack_1010 = fVar179;
      fStack_100c = fVar179;
      local_fd8._4_4_ = local_fd8._8_4_;
      local_fd8._0_4_ = local_fd8._8_4_;
      local_fd8._12_4_ = local_fd8._8_4_;
      local_1098 = (ulong)(local_1008 < 0.0) << 4;
      local_10a0 = (ulong)(fVar179 < 0.0) << 4 | 0x20;
      local_10a8 = (ulong)(local_fd8._8_4_ < 0.0) << 4 | 0x40;
      local_10b0 = local_1098 ^ 0x10;
      local_1028._4_4_ = fVar123;
      local_1028._0_4_ = fVar123;
      local_1028._8_4_ = fVar123;
      local_1028._12_4_ = fVar123;
      local_1108._4_4_ = fVar143;
      local_1108._0_4_ = fVar143;
      fStack_1100 = fVar143;
      fStack_10fc = fVar143;
      local_1060 = (ulong)(((uint)(local_1008 < 0.0) << 4) >> 2);
      local_1068 = local_10b0 >> 2;
      local_1070 = local_10a0 >> 2;
      local_1040 = local_10a0 ^ 0x10;
      local_1078 = (local_10a0 ^ 0x10) >> 2;
      local_1080 = local_10a8 >> 2;
      local_1048 = local_10a8 ^ 0x10;
      local_1088 = (local_10a8 ^ 0x10) >> 2;
      fStack_1114 = local_1118;
      fStack_1110 = local_1118;
      fStack_110c = local_1118;
      _local_1128 = mm_lookupmask_ps._240_8_;
      _uStack_1120 = mm_lookupmask_ps._248_8_;
      uVar77 = local_10a0;
      uVar67 = local_1098;
      uVar74 = local_10b0;
      uVar78 = local_10a8;
      auVar124 = local_1028;
      fVar179 = local_1118;
      fVar123 = local_1118;
      fVar144 = local_1118;
      fVar232 = local_1118;
      do {
        do {
          do {
            if (local_1090 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar60 = local_1090 + -1;
            local_1090 = local_1090 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar60 + 8));
          uVar70 = *(ulong *)*local_1090;
          do {
            if ((uVar70 & 8) == 0) {
              pfVar5 = (float *)(uVar70 + 0x20 + uVar67);
              auVar125._0_4_ = (*pfVar5 - local_fe8) * local_1008;
              auVar125._4_4_ = (pfVar5[1] - fStack_fe4) * fStack_1004;
              auVar125._8_4_ = (pfVar5[2] - fStack_fe0) * fStack_1000;
              auVar125._12_4_ = (pfVar5[3] - fStack_fdc) * fStack_ffc;
              pfVar5 = (float *)(uVar70 + 0x20 + uVar77);
              auVar189._0_4_ = (*pfVar5 - local_ff8) * (float)local_1018._0_4_;
              auVar189._4_4_ = (pfVar5[1] - fStack_ff4) * (float)local_1018._4_4_;
              auVar189._8_4_ = (pfVar5[2] - fStack_ff0) * fStack_1010;
              auVar189._12_4_ = (pfVar5[3] - fStack_fec) * fStack_100c;
              auVar145 = maxps(auVar125,auVar189);
              pfVar5 = (float *)(uVar70 + 0x20 + uVar78);
              auVar196._0_4_ = (*pfVar5 - fVar179) * local_fd8._0_4_;
              auVar196._4_4_ = (pfVar5[1] - fVar123) * local_fd8._4_4_;
              auVar196._8_4_ = (pfVar5[2] - fVar144) * local_fd8._8_4_;
              auVar196._12_4_ = (pfVar5[3] - fVar232) * local_fd8._12_4_;
              pfVar5 = (float *)(uVar70 + 0x20 + uVar74);
              auVar146._0_4_ = (*pfVar5 - local_fe8) * local_1008;
              auVar146._4_4_ = (pfVar5[1] - fStack_fe4) * fStack_1004;
              auVar146._8_4_ = (pfVar5[2] - fStack_fe0) * fStack_1000;
              auVar146._12_4_ = (pfVar5[3] - fStack_fdc) * fStack_ffc;
              pfVar5 = (float *)(uVar70 + 0x20 + local_1040);
              auVar161._0_4_ = (*pfVar5 - local_ff8) * (float)local_1018._0_4_;
              auVar161._4_4_ = (pfVar5[1] - fStack_ff4) * (float)local_1018._4_4_;
              auVar161._8_4_ = (pfVar5[2] - fStack_ff0) * fStack_1010;
              auVar161._12_4_ = (pfVar5[3] - fStack_fec) * fStack_100c;
              auVar147 = minps(auVar146,auVar161);
              pfVar5 = (float *)(uVar70 + 0x20 + local_1048);
              auVar162._0_4_ = (*pfVar5 - fVar179) * local_fd8._0_4_;
              auVar162._4_4_ = (pfVar5[1] - fVar123) * local_fd8._4_4_;
              auVar162._8_4_ = (pfVar5[2] - fVar144) * local_fd8._8_4_;
              auVar162._12_4_ = (pfVar5[3] - fVar232) * local_fd8._12_4_;
              auVar125 = maxps(auVar196,auVar124);
              _local_1208 = maxps(auVar145,auVar125);
              auVar145 = minps(auVar162,_local_1108);
              auVar145 = minps(auVar147,auVar145);
              auVar147._4_4_ = -(uint)(local_1208._4_4_ <= auVar145._4_4_);
              auVar147._0_4_ = -(uint)(local_1208._0_4_ <= auVar145._0_4_);
              auVar147._8_4_ = -(uint)(local_1208._8_4_ <= auVar145._8_4_);
              auVar147._12_4_ = -(uint)(local_1208._12_4_ <= auVar145._12_4_);
              uVar61 = movmskps((int)local_1048,auVar147);
              local_1030 = CONCAT44((int)(local_1048 >> 0x20),uVar61);
            }
            if ((uVar70 & 8) == 0) {
              if (local_1030 == 0) {
                iVar65 = 4;
              }
              else {
                uVar69 = uVar70 & 0xfffffffffffffff0;
                lVar12 = 0;
                if (local_1030 != 0) {
                  for (; (local_1030 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                iVar65 = 0;
                uVar8 = *(ulong *)(uVar69 + lVar12 * 8);
                uVar75 = local_1030 - 1 & local_1030;
                uVar70 = uVar8;
                if (uVar75 != 0) {
                  uVar79 = *(uint *)(local_1208 + lVar12 * 4);
                  lVar12 = 0;
                  if (uVar75 != 0) {
                    for (; (uVar75 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                    }
                  }
                  uVar70 = *(ulong *)(uVar69 + lVar12 * 8);
                  uVar80 = *(uint *)(local_1208 + lVar12 * 4);
                  uVar75 = uVar75 - 1 & uVar75;
                  if (uVar75 == 0) {
                    if (uVar79 < uVar80) {
                      *(ulong *)*local_1090 = uVar70;
                      *(uint *)((long)*local_1090 + 8) = uVar80;
                      uVar70 = uVar8;
                      local_1090 = local_1090 + 1;
                    }
                    else {
                      *(ulong *)*local_1090 = uVar8;
                      *(uint *)((long)*local_1090 + 8) = uVar79;
                      local_1090 = local_1090 + 1;
                    }
                  }
                  else {
                    auVar89._8_4_ = uVar79;
                    auVar89._0_8_ = uVar8;
                    auVar89._12_4_ = 0;
                    auVar126._8_4_ = uVar80;
                    auVar126._0_8_ = uVar70;
                    auVar126._12_4_ = 0;
                    lVar12 = 0;
                    if (uVar75 != 0) {
                      for (; (uVar75 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                      }
                    }
                    uVar70 = *(ulong *)(uVar69 + lVar12 * 8);
                    iVar66 = *(int *)(local_1208 + lVar12 * 4);
                    auVar148._8_4_ = iVar66;
                    auVar148._0_8_ = uVar70;
                    auVar148._12_4_ = 0;
                    auVar163._8_4_ = -(uint)((int)uVar79 < (int)uVar80);
                    uVar75 = uVar75 - 1 & uVar75;
                    if (uVar75 == 0) {
                      auVar163._4_4_ = auVar163._8_4_;
                      auVar163._0_4_ = auVar163._8_4_;
                      auVar163._12_4_ = auVar163._8_4_;
                      auVar145 = auVar89 & auVar163 | ~auVar163 & auVar126;
                      auVar125 = auVar126 & auVar163 | ~auVar163 & auVar89;
                      auVar164._8_4_ = -(uint)(auVar145._8_4_ < iVar66);
                      auVar164._0_8_ = CONCAT44(auVar164._8_4_,auVar164._8_4_);
                      auVar164._12_4_ = auVar164._8_4_;
                      uVar70 = ~auVar164._0_8_ & uVar70 | auVar145._0_8_ & auVar164._0_8_;
                      auVar145 = auVar148 & auVar164 | ~auVar164 & auVar145;
                      auVar90._8_4_ = -(uint)(auVar125._8_4_ < auVar145._8_4_);
                      auVar90._4_4_ = auVar90._8_4_;
                      auVar90._0_4_ = auVar90._8_4_;
                      auVar90._12_4_ = auVar90._8_4_;
                      *local_1090 = ~auVar90 & auVar125 | auVar145 & auVar90;
                      local_1090[1] = auVar125 & auVar90 | ~auVar90 & auVar145;
                      local_1090 = local_1090 + 2;
                    }
                    else {
                      lVar12 = 0;
                      if (uVar75 != 0) {
                        for (; (uVar75 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                        }
                      }
                      iVar7 = *(int *)(local_1208 + lVar12 * 4);
                      auVar188._8_4_ = iVar7;
                      auVar188._0_8_ = *(undefined8 *)(uVar69 + lVar12 * 8);
                      auVar188._12_4_ = 0;
                      auVar165._4_4_ = auVar163._8_4_;
                      auVar165._0_4_ = auVar163._8_4_;
                      auVar165._8_4_ = auVar163._8_4_;
                      auVar165._12_4_ = auVar163._8_4_;
                      auVar145 = auVar89 & auVar165 | ~auVar165 & auVar126;
                      auVar125 = auVar126 & auVar165 | ~auVar165 & auVar89;
                      auVar195._0_4_ = -(uint)(iVar66 < iVar7);
                      auVar195._4_4_ = -(uint)(iVar66 < iVar7);
                      auVar195._8_4_ = -(uint)(iVar66 < iVar7);
                      auVar195._12_4_ = -(uint)(iVar66 < iVar7);
                      auVar147 = auVar148 & auVar195 | ~auVar195 & auVar188;
                      auVar196 = ~auVar195 & auVar148 | auVar188 & auVar195;
                      auVar149._8_4_ = -(uint)(auVar125._8_4_ < auVar196._8_4_);
                      auVar149._4_4_ = auVar149._8_4_;
                      auVar149._0_4_ = auVar149._8_4_;
                      auVar149._12_4_ = auVar149._8_4_;
                      auVar189 = auVar125 & auVar149 | ~auVar149 & auVar196;
                      auVar127._8_4_ = -(uint)(auVar145._8_4_ < auVar147._8_4_);
                      auVar127._0_8_ = CONCAT44(auVar127._8_4_,auVar127._8_4_);
                      auVar127._12_4_ = auVar127._8_4_;
                      uVar70 = auVar145._0_8_ & auVar127._0_8_ | ~auVar127._0_8_ & auVar147._0_8_;
                      auVar145 = ~auVar127 & auVar145 | auVar147 & auVar127;
                      auVar91._8_4_ = -(uint)(auVar145._8_4_ < auVar189._8_4_);
                      auVar91._4_4_ = auVar91._8_4_;
                      auVar91._0_4_ = auVar91._8_4_;
                      auVar91._12_4_ = auVar91._8_4_;
                      *local_1090 = ~auVar149 & auVar125 | auVar196 & auVar149;
                      local_1090[1] = ~auVar91 & auVar145 | auVar189 & auVar91;
                      local_1090[2] = auVar145 & auVar91 | ~auVar91 & auVar189;
                      local_1090 = local_1090 + 3;
                      fVar179 = local_1118;
                      fVar123 = fStack_1114;
                      fVar144 = fStack_1110;
                      fVar232 = fStack_110c;
                    }
                  }
                }
              }
            }
            else {
              iVar65 = 6;
            }
          } while (iVar65 == 0);
        } while (iVar65 != 6);
        local_1050 = (ulong)((uint)uVar70 & 0xf) - 8;
        if (local_1050 != 0) {
          local_1038 = 0;
          local_1058 = uVar70 & 0xfffffffffffffff0;
          do {
            lVar62 = local_1038 * 0x58;
            lVar12 = local_1058 + lVar62;
            uVar6 = *(undefined8 *)(local_1058 + 0x20 + lVar62);
            uVar61 = *(undefined4 *)(local_1058 + 0x24 + lVar62);
            bVar120 = (byte)uVar6;
            bVar83 = (byte)uVar61;
            bVar13 = (byte)((ulong)uVar6 >> 8);
            bVar110 = (byte)((uint)uVar61 >> 8);
            bVar14 = (byte)((ulong)uVar6 >> 0x10);
            bVar112 = (byte)((uint)uVar61 >> 0x10);
            bVar16 = (byte)((uint)uVar61 >> 0x18);
            bVar15 = (byte)((ulong)uVar6 >> 0x18);
            cVar84 = -((byte)((bVar120 < bVar83) * bVar120 | (bVar120 >= bVar83) * bVar83) ==
                      bVar120);
            cVar111 = -((byte)((bVar13 < bVar110) * bVar13 | (bVar13 >= bVar110) * bVar110) ==
                       bVar13);
            cVar113 = -((byte)((bVar14 < bVar112) * bVar14 | (bVar14 >= bVar112) * bVar112) ==
                       bVar14);
            cVar114 = -((byte)((bVar15 < bVar16) * bVar15 | (bVar15 >= bVar16) * bVar16) == bVar15);
            cVar115 = -((char)((ulong)uVar6 >> 0x20) == '\0');
            cVar117 = -((char)((ulong)uVar6 >> 0x28) == '\0');
            cVar118 = -((char)((ulong)uVar6 >> 0x30) == '\0');
            bVar120 = -((char)((ulong)uVar6 >> 0x38) == '\0');
            auVar93._0_9_ = CONCAT18(0xff,(ulong)bVar120 << 0x38);
            auVar86._0_10_ = CONCAT19(0xff,auVar93._0_9_);
            auVar86[10] = 0xff;
            auVar87[0xb] = 0xff;
            auVar87._0_11_ = auVar86;
            auVar88[0xc] = 0xff;
            auVar88._0_12_ = auVar87;
            auVar98[0xd] = 0xff;
            auVar98._0_13_ = auVar88;
            fVar179 = *(float *)(local_1058 + 0x38 + lVar62);
            fVar123 = *(float *)(local_1058 + 0x3c + lVar62);
            fVar144 = *(float *)(local_1058 + 0x44 + lVar62);
            uVar61 = *(undefined4 *)(local_1060 + 0x20 + lVar12);
            Var18 = CONCAT91((unkuint9)0 << 8,(char)((uint)uVar61 >> 0x18));
            auVar35[10] = 0;
            auVar35._0_10_ = Var18;
            auVar129[4] = (char)((uint)uVar61 >> 0x10);
            auVar129._0_4_ = uVar61;
            auVar129._5_11_ = auVar35 << 8;
            auVar34[0xc] = 0;
            auVar34._0_12_ = auVar129._4_12_;
            auVar17._1_13_ = auVar34 << 8;
            auVar17[0] = (char)((uint)uVar61 >> 8);
            auVar128._0_2_ = CONCAT11(0,(byte)uVar61);
            auVar128._2_14_ = auVar17;
            uVar141 = (ushort)Var18;
            auVar46._10_2_ = 0;
            auVar46._0_10_ = auVar128._0_10_;
            auVar46._12_2_ = uVar141;
            uVar54 = CONCAT42(auVar46._10_4_,auVar129._4_2_);
            auVar19._2_10_ = (unkuint10)uVar54 << 0x10;
            auVar19._0_2_ = auVar17._0_2_;
            uVar61 = *(undefined4 *)(local_1068 + 0x20 + lVar12);
            Var18 = CONCAT91((unkuint9)0 << 8,(char)((uint)uVar61 >> 0x18));
            auVar37[10] = 0;
            auVar37._0_10_ = Var18;
            auVar151[4] = (char)((uint)uVar61 >> 0x10);
            auVar151._0_4_ = uVar61;
            auVar151._5_11_ = auVar37 << 8;
            auVar36[0xc] = 0;
            auVar36._0_12_ = auVar151._4_12_;
            auVar20._1_13_ = auVar36 << 8;
            auVar20[0] = (char)((uint)uVar61 >> 8);
            auVar150._0_2_ = CONCAT11(0,(byte)uVar61);
            auVar150._2_14_ = auVar20;
            uVar157 = (ushort)Var18;
            auVar47._10_2_ = 0;
            auVar47._0_10_ = auVar150._0_10_;
            auVar47._12_2_ = uVar157;
            uVar55 = CONCAT42(auVar47._10_4_,auVar151._4_2_);
            auVar21._2_10_ = (unkuint10)uVar55 << 0x10;
            auVar21._0_2_ = auVar20._0_2_;
            fVar232 = *(float *)(local_1058 + 0x48 + lVar62);
            uVar61 = *(undefined4 *)(local_1070 + 0x20 + lVar12);
            Var18 = CONCAT91((unkuint9)0 << 8,(char)((uint)uVar61 >> 0x18));
            auVar39[10] = 0;
            auVar39._0_10_ = Var18;
            auVar167[4] = (char)((uint)uVar61 >> 0x10);
            auVar167._0_4_ = uVar61;
            auVar167._5_11_ = auVar39 << 8;
            auVar38[0xc] = 0;
            auVar38._0_12_ = auVar167._4_12_;
            auVar22._1_13_ = auVar38 << 8;
            auVar22[0] = (char)((uint)uVar61 >> 8);
            auVar166._0_2_ = CONCAT11(0,(byte)uVar61);
            auVar166._2_14_ = auVar22;
            uVar181 = (ushort)Var18;
            auVar48._10_2_ = 0;
            auVar48._0_10_ = auVar166._0_10_;
            auVar48._12_2_ = uVar181;
            uVar56 = CONCAT42(auVar48._10_4_,auVar167._4_2_);
            auVar23._2_10_ = (unkuint10)uVar56 << 0x10;
            auVar23._0_2_ = auVar22._0_2_;
            uVar61 = *(undefined4 *)(local_1078 + 0x20 + lVar12);
            Var18 = CONCAT91((unkuint9)0 << 8,(char)((uint)uVar61 >> 0x18));
            auVar41[10] = 0;
            auVar41._0_10_ = Var18;
            auVar169[4] = (char)((uint)uVar61 >> 0x10);
            auVar169._0_4_ = uVar61;
            auVar169._5_11_ = auVar41 << 8;
            auVar40[0xc] = 0;
            auVar40._0_12_ = auVar169._4_12_;
            auVar24._1_13_ = auVar40 << 8;
            auVar24[0] = (char)((uint)uVar61 >> 8);
            auVar168._0_2_ = CONCAT11(0,(byte)uVar61);
            auVar168._2_14_ = auVar24;
            uVar182 = (ushort)Var18;
            auVar49._10_2_ = 0;
            auVar49._0_10_ = auVar168._0_10_;
            auVar49._12_2_ = uVar182;
            uVar57 = CONCAT42(auVar49._10_4_,auVar169._4_2_);
            auVar25._2_10_ = (unkuint10)uVar57 << 0x10;
            auVar25._0_2_ = auVar24._0_2_;
            fVar140 = *(float *)(local_1058 + 0x4c + lVar62);
            uVar61 = *(undefined4 *)(local_1080 + 0x20 + lVar12);
            Var18 = CONCAT91((unkuint9)0 << 8,(char)((uint)uVar61 >> 0x18));
            auVar43[10] = 0;
            auVar43._0_10_ = Var18;
            auVar198[4] = (char)((uint)uVar61 >> 0x10);
            auVar198._0_4_ = uVar61;
            auVar198._5_11_ = auVar43 << 8;
            auVar42[0xc] = 0;
            auVar42._0_12_ = auVar198._4_12_;
            auVar26._1_13_ = auVar42 << 8;
            auVar26[0] = (char)((uint)uVar61 >> 8);
            auVar197._0_2_ = CONCAT11(0,(byte)uVar61);
            auVar197._2_14_ = auVar26;
            uVar202 = (ushort)Var18;
            auVar50._10_2_ = 0;
            auVar50._0_10_ = auVar197._0_10_;
            auVar50._12_2_ = uVar202;
            uVar58 = CONCAT42(auVar50._10_4_,auVar198._4_2_);
            auVar27._2_10_ = (unkuint10)uVar58 << 0x10;
            auVar27._0_2_ = auVar26._0_2_;
            uVar61 = *(undefined4 *)(local_1088 + 0x20 + lVar12);
            Var18 = CONCAT91((unkuint9)0 << 8,(char)((uint)uVar61 >> 0x18));
            auVar45[10] = 0;
            auVar45._0_10_ = Var18;
            auVar208[4] = (char)((uint)uVar61 >> 0x10);
            auVar208._0_4_ = uVar61;
            auVar208._5_11_ = auVar45 << 8;
            auVar44[0xc] = 0;
            auVar44._0_12_ = auVar208._4_12_;
            auVar28._1_13_ = auVar44 << 8;
            auVar28[0] = (char)((uint)uVar61 >> 8);
            auVar207._0_2_ = CONCAT11(0,(byte)uVar61);
            auVar207._2_14_ = auVar28;
            uVar212 = (ushort)Var18;
            auVar51._10_2_ = 0;
            auVar51._0_10_ = auVar207._0_10_;
            auVar51._12_2_ = uVar212;
            uVar59 = CONCAT42(auVar51._10_4_,auVar208._4_2_);
            auVar29._2_10_ = (unkuint10)uVar59 << 0x10;
            auVar29._0_2_ = auVar28._0_2_;
            fVar233 = *(float *)(local_1058 + 0x40 + lVar62);
            auVar130._0_4_ = (((float)auVar128._0_2_ * fVar144 + fVar179) - local_fe8) * local_1008;
            auVar130._4_4_ = (((float)auVar19._0_4_ * fVar144 + fVar179) - fStack_fe4) * fStack_1004
            ;
            auVar130._8_4_ = (((float)(int)uVar54 * fVar144 + fVar179) - fStack_fe0) * fStack_1000;
            auVar130._12_4_ = (((float)uVar141 * fVar144 + fVar179) - fStack_fdc) * fStack_ffc;
            auVar190._0_4_ =
                 (((float)auVar166._0_2_ * fVar232 + fVar123) - local_ff8) * (float)local_1018._0_4_
            ;
            auVar190._4_4_ =
                 (((float)auVar23._0_4_ * fVar232 + fVar123) - fStack_ff4) * (float)local_1018._4_4_
            ;
            auVar190._8_4_ = (((float)(int)uVar56 * fVar232 + fVar123) - fStack_ff0) * fStack_1010;
            auVar190._12_4_ = (((float)uVar181 * fVar232 + fVar123) - fStack_fec) * fStack_100c;
            auVar124 = maxps(auVar130,auVar190);
            auVar152._0_4_ = (((float)auVar150._0_2_ * fVar144 + fVar179) - local_fe8) * local_1008;
            auVar152._4_4_ = (((float)auVar21._0_4_ * fVar144 + fVar179) - fStack_fe4) * fStack_1004
            ;
            auVar152._8_4_ = (((float)(int)uVar55 * fVar144 + fVar179) - fStack_fe0) * fStack_1000;
            auVar152._12_4_ = (((float)uVar157 * fVar144 + fVar179) - fStack_fdc) * fStack_ffc;
            auVar170._0_4_ =
                 (((float)auVar168._0_2_ * fVar232 + fVar123) - local_ff8) * (float)local_1018._0_4_
            ;
            auVar170._4_4_ =
                 (((float)auVar25._0_4_ * fVar232 + fVar123) - fStack_ff4) * (float)local_1018._4_4_
            ;
            auVar170._8_4_ = (((float)(int)uVar57 * fVar232 + fVar123) - fStack_ff0) * fStack_1010;
            auVar170._12_4_ = (((float)uVar182 * fVar232 + fVar123) - fStack_fec) * fStack_100c;
            auVar145 = minps(auVar152,auVar170);
            auVar199._0_4_ =
                 (((float)auVar197._0_2_ * fVar140 + fVar233) - local_1118) * local_fd8._0_4_;
            auVar199._4_4_ =
                 (((float)auVar27._0_4_ * fVar140 + fVar233) - fStack_1114) * local_fd8._4_4_;
            auVar199._8_4_ =
                 (((float)(int)uVar58 * fVar140 + fVar233) - fStack_1110) * local_fd8._8_4_;
            auVar199._12_4_ =
                 (((float)uVar202 * fVar140 + fVar233) - fStack_110c) * local_fd8._12_4_;
            auVar125 = maxps(auVar199,local_1028);
            local_f88 = maxps(auVar124,auVar125);
            auVar209._0_4_ =
                 (((float)auVar207._0_2_ * fVar140 + fVar233) - local_1118) * local_fd8._0_4_;
            auVar209._4_4_ =
                 (((float)auVar29._0_4_ * fVar140 + fVar233) - fStack_1114) * local_fd8._4_4_;
            auVar209._8_4_ =
                 (((float)(int)uVar59 * fVar140 + fVar233) - fStack_1110) * local_fd8._8_4_;
            auVar209._12_4_ =
                 (((float)uVar212 * fVar140 + fVar233) - fStack_110c) * local_fd8._12_4_;
            auVar124 = minps(auVar209,_local_1108);
            auVar124 = minps(auVar145,auVar124);
            auVar98[0xe] = bVar120;
            auVar98[0xf] = bVar120;
            auVar97._14_2_ = auVar98._14_2_;
            auVar97[0xd] = cVar118;
            auVar97._0_13_ = auVar88;
            auVar96._13_3_ = auVar97._13_3_;
            auVar96[0xc] = cVar118;
            auVar96._0_12_ = auVar87;
            auVar95._12_4_ = auVar96._12_4_;
            auVar95[0xb] = cVar117;
            auVar95._0_11_ = auVar86;
            auVar94._11_5_ = auVar95._11_5_;
            auVar94[10] = cVar117;
            auVar94._0_10_ = auVar86._0_10_;
            auVar93._10_6_ = auVar94._10_6_;
            auVar93[9] = cVar115;
            Var32 = CONCAT91(CONCAT81((long)(CONCAT72(auVar93._9_7_,CONCAT11(cVar115,bVar120)) >> 8)
                                      ,cVar114),cVar114);
            auVar31._2_10_ = Var32;
            auVar31[1] = cVar113;
            auVar31[0] = cVar113;
            auVar30._2_12_ = auVar31;
            auVar30[1] = cVar111;
            auVar30[0] = cVar111;
            auVar92._0_2_ = CONCAT11(cVar84,cVar84);
            auVar92._2_14_ = auVar30;
            uVar119 = (undefined2)Var32;
            auVar101._0_12_ = auVar92._0_12_;
            auVar101._12_2_ = uVar119;
            auVar101._14_2_ = uVar119;
            auVar100._12_4_ = auVar101._12_4_;
            auVar100._0_10_ = auVar92._0_10_;
            auVar100._10_2_ = auVar31._0_2_;
            auVar99._10_6_ = auVar100._10_6_;
            auVar99._0_8_ = auVar92._0_8_;
            auVar99._8_2_ = auVar31._0_2_;
            auVar33._4_8_ = auVar99._8_8_;
            auVar33._2_2_ = auVar30._0_2_;
            auVar33._0_2_ = auVar30._0_2_;
            uVar79 = CONCAT22(auVar92._0_2_,auVar92._0_2_);
            auVar131._0_4_ = -(uint)(local_f88._0_4_ <= auVar124._0_4_) & uVar79;
            auVar131._4_4_ = -(uint)(local_f88._4_4_ <= auVar124._4_4_) & auVar33._0_4_;
            auVar131._8_4_ = -(uint)(local_f88._8_4_ <= auVar124._8_4_) & auVar99._8_4_;
            auVar131._12_4_ = -(uint)(local_f88._12_4_ <= auVar124._12_4_) & auVar100._12_4_;
            uVar79 = movmskps((int)lVar62,auVar131);
            if (uVar79 != 0) {
              uVar77 = (ulong)(uVar79 & 0xff);
              do {
                lVar62 = 0;
                if (uVar77 != 0) {
                  for (; (uVar77 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                  }
                }
                fVar179 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_f88 + lVar62 * 4) <= fVar179) {
                  local_10e8 = ZEXT416((uint)fVar179);
                  uVar79 = *(uint *)(lVar12 + 0x50);
                  local_12d4._4_8_ = ZEXT48(uVar79);
                  uVar80 = *(uint *)(lVar12 + 4 + lVar62 * 8);
                  pSVar63 = context->scene;
                  pGVar72 = (pSVar63->geometries).items[local_12d4._4_8_].ptr;
                  lVar9 = *(long *)&pGVar72->field_0x58;
                  lVar71 = (ulong)uVar80 *
                           pGVar72[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  lVar10 = *(long *)&pGVar72[1].time_range.upper;
                  uVar67 = *(ulong *)(lVar12 + lVar62 * 8);
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = uVar67;
                  auVar102 = auVar102 & _DAT_0201c980;
                  auVar52._10_2_ = 0;
                  auVar52._0_10_ = auVar102._0_10_;
                  auVar52._12_2_ = auVar102._6_2_;
                  auVar53._8_2_ = auVar102._4_2_;
                  auVar53._0_8_ = auVar102._0_8_;
                  auVar53._10_4_ = auVar52._10_4_;
                  auVar171._0_4_ = auVar102._0_4_;
                  auVar171._4_2_ = auVar102._2_2_;
                  auVar171._6_10_ = (unkuint10)auVar53._8_6_ << 0x10;
                  local_fc8._4_12_ = auVar171._4_12_;
                  local_fc8._0_4_ = CONCAT22(0,auVar102._0_2_);
                  uVar74 = *(ulong *)(lVar9 + lVar71);
                  uVar78 = (ulong)(uint)((int)((ulong)(auVar171._0_4_ >> 0x10) * (uVar74 >> 0x20)) +
                                        (int)uVar74 + local_fc8._0_4_);
                  p_Var11 = pGVar72[1].intersectionFilterN;
                  pfVar5 = (float *)(lVar10 + (long)p_Var11 * uVar78);
                  fVar123 = *pfVar5;
                  fVar144 = pfVar5[1];
                  fVar232 = pfVar5[2];
                  pfVar5 = (float *)(lVar10 + (uVar78 + 1) * (long)p_Var11);
                  fVar140 = *pfVar5;
                  local_f98 = pfVar5[1];
                  fVar233 = pfVar5[2];
                  uVar74 = uVar74 >> 0x20;
                  lVar62 = uVar78 + uVar74 + 1;
                  pfVar5 = (float *)(lVar10 + (uVar78 + uVar74) * (long)p_Var11);
                  fVar143 = *pfVar5;
                  fVar159 = pfVar5[1];
                  fVar206 = pfVar5[2];
                  pfVar5 = (float *)(lVar10 + lVar62 * (long)p_Var11);
                  local_1288._0_4_ = (uint)*pfVar5;
                  local_1268 = pfVar5[1];
                  fVar211 = pfVar5[2];
                  uVar70 = (ulong)(-1 < (short)uVar67);
                  pfVar5 = (float *)(lVar10 + (uVar78 + uVar70 + 1) * (long)p_Var11);
                  lVar76 = uVar70 + lVar62;
                  uVar70 = 0;
                  if (-1 < (short)(uVar67 >> 0x10)) {
                    uVar70 = uVar74;
                  }
                  pfVar1 = (float *)(lVar10 + lVar76 * (long)p_Var11);
                  local_1288._4_4_ = (uint)*pfVar1;
                  fStack_1264 = pfVar1[1];
                  pfVar2 = (float *)(lVar10 + (uVar78 + uVar74 + uVar70) * (long)p_Var11);
                  pfVar3 = (float *)(lVar10 + (lVar62 + uVar70) * (long)p_Var11);
                  local_1278._4_4_ = *pfVar3;
                  fStack_125c = pfVar3[1];
                  pfVar4 = (float *)(lVar10 + (uVar70 + lVar76) * (long)p_Var11);
                  fStack_1260 = pfVar4[1];
                  local_1228 = CONCAT44(*pfVar5,fVar140);
                  fStack_1218 = (float)local_1288._4_4_;
                  fStack_1214 = (float)local_1288._0_4_;
                  local_1278._0_4_ = *pfVar4;
                  local_fb8 = CONCAT44(fVar211,fVar206);
                  local_fa8 = pfVar3[2];
                  fStack_fa4 = pfVar2[2];
                  fStack_f94 = pfVar5[1];
                  fStack_f90 = fStack_1264;
                  fStack_f8c = local_1268;
                  fVar220 = fVar144 - local_f98;
                  fVar222 = local_f98 - pfVar5[1];
                  fVar224 = local_1268 - fStack_1264;
                  fVar226 = fVar159 - local_1268;
                  fVar234 = fVar232 - fVar233;
                  fVar236 = fVar233 - pfVar5[2];
                  fVar238 = fVar211 - pfVar1[2];
                  fVar240 = fVar206 - fVar211;
                  fStack_10c0 = fStack_125c;
                  fStack_10bc = pfVar2[1];
                  fVar213 = fVar159 - fVar144;
                  fVar214 = local_1268 - local_f98;
                  fVar215 = fStack_125c - local_1268;
                  fVar216 = pfVar2[1] - fVar159;
                  fVar85 = fVar206 - fVar232;
                  fVar116 = fVar211 - fVar233;
                  fVar121 = pfVar3[2] - fVar211;
                  fVar122 = pfVar2[2] - fVar206;
                  fVar187 = fVar234 * fVar213 - fVar220 * fVar85;
                  fVar192 = fVar236 * fVar214 - fVar222 * fVar116;
                  fStack_1130 = fVar238 * fVar215 - fVar224 * fVar121;
                  fStack_112c = fVar240 * fVar216 - fVar226 * fVar122;
                  local_10d8 = CONCAT44(local_1288._0_4_,fVar143);
                  local_10c8 = local_1278._4_4_;
                  fStack_10c4 = *pfVar2;
                  fVar193 = fVar143 - fVar123;
                  fVar200 = (float)local_1288._0_4_ - fVar140;
                  fVar203 = local_1278._4_4_ - (float)local_1288._0_4_;
                  fVar205 = *pfVar2 - fVar143;
                  fStack_10ec = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar194 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fStack_113c = (ray->super_RayK<1>).org.field_0.m128[2];
                  fVar217 = fVar123 - fStack_10ec;
                  fVar219 = fVar140 - fStack_10ec;
                  fStack_10f0 = (float)local_1288._0_4_ - fStack_10ec;
                  fStack_10ec = fVar143 - fStack_10ec;
                  fVar144 = fVar144 - fVar194;
                  fVar156 = local_f98 - fVar194;
                  fVar158 = local_1268 - fVar194;
                  fVar159 = fVar159 - fVar194;
                  fVar194 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fVar201 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  fVar204 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  fVar160 = fVar217 * fVar201 - fVar144 * fVar194;
                  fVar180 = fVar219 * fVar201 - fVar156 * fVar194;
                  fVar183 = fStack_10f0 * fVar201 - fVar158 * fVar194;
                  fVar185 = fStack_10ec * fVar201 - fVar159 * fVar194;
                  fVar123 = fVar123 - fVar140;
                  fVar140 = fVar140 - *pfVar5;
                  fVar142 = (float)local_1288._0_4_ - fStack_1220;
                  fVar143 = fVar143 - fStack_121c;
                  local_1168[0] = fVar123 * fVar85 - fVar234 * fVar193;
                  local_1168[1] = fVar140 * fVar116 - fVar236 * fVar200;
                  local_1168[2] = fVar142 * fVar121 - fVar238 * fVar203;
                  local_1168[3] = fVar143 * fVar122 - fVar240 * fVar205;
                  fVar232 = fVar232 - fStack_113c;
                  fVar233 = fVar233 - fStack_113c;
                  fStack_1140 = fVar211 - fStack_113c;
                  fStack_113c = fVar206 - fStack_113c;
                  local_10f8 = (RTCRayQueryContext *)CONCAT44(fVar219,fVar217);
                  fVar242 = fVar232 * fVar194 - fVar217 * fVar204;
                  fVar243 = fVar233 * fVar194 - fVar219 * fVar204;
                  fVar244 = fStack_1140 * fVar194 - fStack_10f0 * fVar204;
                  fVar245 = fStack_113c * fVar194 - fStack_10ec * fVar204;
                  fVar221 = fVar220 * fVar193 - fVar123 * fVar213;
                  fVar223 = fVar222 * fVar200 - fVar140 * fVar214;
                  fVar225 = fVar224 * fVar203 - fVar142 * fVar215;
                  fVar227 = fVar226 * fVar205 - fVar143 * fVar216;
                  local_1148 = (RTCIntersectArguments *)CONCAT44(fVar233,fVar232);
                  fVar235 = fVar144 * fVar204 - fVar232 * fVar201;
                  fVar237 = fVar156 * fVar204 - fVar233 * fVar201;
                  fVar239 = fVar158 * fVar204 - fStack_1140 * fVar201;
                  fVar241 = fVar159 * fVar204 - fStack_113c * fVar201;
                  local_1138 = CONCAT44(fVar192,fVar187);
                  fVar228 = fVar194 * fVar187 + fVar201 * local_1168[0] + fVar204 * fVar221;
                  fVar229 = fVar194 * fVar192 + fVar201 * local_1168[1] + fVar204 * fVar223;
                  fVar230 = fVar194 * fStack_1130 + fVar201 * local_1168[2] + fVar204 * fVar225;
                  fVar231 = fVar194 * fStack_112c + fVar201 * local_1168[3] + fVar204 * fVar227;
                  uVar81 = (uint)fVar228 & 0x80000000;
                  uVar82 = (uint)fVar229 & 0x80000000;
                  uVar184 = (uint)fVar230 & 0x80000000;
                  uVar186 = (uint)fVar231 & 0x80000000;
                  fVar194 = (float)((uint)(fVar193 * fVar235 + fVar213 * fVar242 + fVar85 * fVar160)
                                   ^ uVar81);
                  fVar201 = (float)((uint)(fVar200 * fVar237 + fVar214 * fVar243 + fVar116 * fVar180
                                          ) ^ uVar82);
                  fVar204 = (float)((uint)(fVar203 * fVar239 + fVar215 * fVar244 + fVar121 * fVar183
                                          ) ^ uVar184);
                  fVar85 = (float)((uint)(fVar205 * fVar241 + fVar216 * fVar245 + fVar122 * fVar185)
                                  ^ uVar186);
                  fVar116 = (float)((uint)(fVar235 * fVar123 + fVar242 * fVar220 + fVar160 * fVar234
                                          ) ^ uVar81);
                  fVar121 = (float)((uint)(fVar237 * fVar140 + fVar243 * fVar222 + fVar180 * fVar236
                                          ) ^ uVar82);
                  fVar122 = (float)((uint)(fVar239 * fVar142 + fVar244 * fVar224 + fVar183 * fVar238
                                          ) ^ uVar184);
                  fVar143 = (float)((uint)(fVar241 * fVar143 + fVar245 * fVar226 + fVar185 * fVar240
                                          ) ^ uVar186);
                  fVar123 = ABS(fVar228);
                  fVar140 = ABS(fVar229);
                  local_11d8._0_8_ = CONCAT44(fVar229,fVar228) & 0x7fffffff7fffffff;
                  local_11d8._8_4_ = ABS(fVar230);
                  local_11d8._12_4_ = ABS(fVar231);
                  auVar218._0_4_ =
                       -(uint)((0.0 <= fVar194 && 0.0 <= fVar116) && fVar228 != 0.0) & local_1128 &
                       -(uint)(fVar194 + fVar116 <= fVar123);
                  auVar218._4_4_ =
                       -(uint)((0.0 <= fVar201 && 0.0 <= fVar121) && fVar229 != 0.0) & uStack_1124 &
                       -(uint)(fVar201 + fVar121 <= fVar140);
                  auVar218._8_4_ =
                       -(uint)((0.0 <= fVar204 && 0.0 <= fVar122) && fVar230 != 0.0) & uStack_1120 &
                       -(uint)(fVar204 + fVar122 <= local_11d8._8_4_);
                  auVar218._12_4_ =
                       -(uint)((0.0 <= fVar85 && 0.0 <= fVar143) && fVar231 != 0.0) & uStack_111c &
                       -(uint)(fVar85 + fVar143 <= local_11d8._12_4_);
                  iVar65 = movmskps((int)lVar10,auVar218);
                  if (iVar65 != 0) {
                    local_11e8._0_4_ =
                         uVar81 ^ (uint)(fVar217 * fVar187 +
                                        fVar144 * local_1168[0] + fVar232 * fVar221);
                    local_11e8._4_4_ =
                         uVar82 ^ (uint)(fVar219 * fVar192 +
                                        fVar156 * local_1168[1] + fVar233 * fVar223);
                    fStack_11e0 = (float)(uVar184 ^
                                         (uint)(fStack_10f0 * fStack_1130 +
                                               fVar158 * local_1168[2] + fStack_1140 * fVar225));
                    fStack_11dc = (float)(uVar186 ^
                                         (uint)(fStack_10ec * fStack_112c +
                                               fVar159 * local_1168[3] + fStack_113c * fVar227));
                    fVar144 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar103._0_4_ =
                         -(uint)(fVar144 * fVar123 < (float)local_11e8._0_4_ &&
                                (float)local_11e8._0_4_ <= fVar179 * fVar123) & auVar218._0_4_;
                    auVar103._4_4_ =
                         -(uint)(fVar144 * fVar140 < (float)local_11e8._4_4_ &&
                                (float)local_11e8._4_4_ <= fVar179 * fVar140) & auVar218._4_4_;
                    auVar103._8_4_ =
                         -(uint)(fVar144 * local_11d8._8_4_ < fStack_11e0 &&
                                fStack_11e0 <= fVar179 * local_11d8._8_4_) & auVar218._8_4_;
                    auVar103._12_4_ =
                         -(uint)(fVar144 * local_11d8._12_4_ < fStack_11dc &&
                                fStack_11dc <= fVar179 * local_11d8._12_4_) & auVar218._12_4_;
                    iVar65 = movmskps(iVar65,auVar103);
                    if (iVar65 != 0) {
                      local_11b8 = auVar103;
                      local_1178 = local_1138;
                      uStack_1170 = CONCAT44(fStack_112c,fStack_1130);
                      local_1158 = CONCAT44(fVar223,fVar221);
                      uStack_1150 = CONCAT44(fVar227,fVar225);
                      local_fc8._4_4_ = auVar171._4_4_;
                      fVar179 = (float)(int)(*(ushort *)(lVar9 + 8 + lVar71) - 1);
                      auVar124 = rcpss(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179));
                      fVar144 = (2.0 - fVar179 * auVar124._0_4_) * auVar124._0_4_;
                      fVar179 = (float)(int)(*(ushort *)(lVar9 + 10 + lVar71) - 1);
                      auVar124 = rcpss(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179));
                      auVar172._0_4_ = (float)local_fc8._0_4_ * fVar123 + fVar194;
                      auVar172._4_4_ = (float)(local_fc8._0_4_ + 1) * fVar140 + fVar201;
                      auVar172._8_4_ = (float)(local_fc8._0_4_ + 1) * local_11d8._8_4_ + fVar204;
                      auVar172._12_4_ = (float)local_fc8._0_4_ * local_11d8._12_4_ + fVar85;
                      fStack_11ec = (2.0 - fVar179 * auVar124._0_4_) * auVar124._0_4_;
                      local_1208._4_4_ = fVar144 * auVar172._4_4_;
                      local_1208._0_4_ = fVar144 * auVar172._0_4_;
                      fStack_1200 = fVar144 * auVar172._8_4_;
                      fStack_11fc = fVar144 * auVar172._12_4_;
                      local_11f8 = fStack_11ec * ((float)local_fc8._4_4_ * fVar123 + fVar116);
                      fStack_11f4 = fStack_11ec * ((float)local_fc8._4_4_ * fVar140 + fVar121);
                      fStack_11f0 = fStack_11ec *
                                    ((float)(local_fc8._4_4_ + 1) * local_11d8._8_4_ + fVar122);
                      fStack_11ec = fStack_11ec *
                                    ((float)(local_fc8._4_4_ + 1) * local_11d8._12_4_ + fVar143);
                      pGVar72 = (pSVar63->geometries).items[local_12d4._4_8_].ptr;
                      uVar81 = (ray->super_RayK<1>).mask;
                      pSVar63 = (Scene *)(ulong)uVar81;
                      if ((pGVar72->mask & uVar81) != 0) {
                        stack0xffffffffffffed38 = auVar103;
                        auVar124 = rcpps(auVar172,local_11d8);
                        fVar179 = auVar124._0_4_;
                        fVar232 = auVar124._4_4_;
                        fVar233 = auVar124._8_4_;
                        fVar143 = auVar124._12_4_;
                        fVar179 = (1.0 - fVar123 * fVar179) * fVar179 + fVar179;
                        fVar232 = (1.0 - fVar140 * fVar232) * fVar232 + fVar232;
                        fVar233 = (1.0 - local_11d8._8_4_ * fVar233) * fVar233 + fVar233;
                        fVar143 = (1.0 - local_11d8._12_4_ * fVar143) * fVar143 + fVar143;
                        local_1188[0] = (float)local_11e8._0_4_ * fVar179;
                        local_1188[1] = (float)local_11e8._4_4_ * fVar232;
                        local_1188[2] = fStack_11e0 * fVar233;
                        local_1188[3] = fStack_11dc * fVar143;
                        local_11a8[0] = fVar144 * auVar172._0_4_ * fVar179;
                        local_11a8[1] = fVar144 * auVar172._4_4_ * fVar232;
                        local_11a8[2] = fVar144 * auVar172._8_4_ * fVar233;
                        local_11a8[3] = fVar144 * auVar172._12_4_ * fVar143;
                        local_1198[0] = local_11f8 * fVar179;
                        local_1198[1] = fStack_11f4 * fVar232;
                        local_1198[2] = fStack_11f0 * fVar233;
                        local_1198[3] = fStack_11ec * fVar143;
                        auVar173._0_4_ = (uint)((float)local_11e8._0_4_ * fVar179) & auVar103._0_4_;
                        auVar173._4_4_ = (uint)((float)local_11e8._4_4_ * fVar232) & auVar103._4_4_;
                        auVar173._8_4_ = (uint)(fStack_11e0 * fVar233) & auVar103._8_4_;
                        auVar173._12_4_ = (uint)(fStack_11dc * fVar143) & auVar103._12_4_;
                        auVar132._0_8_ =
                             CONCAT44(~auVar103._4_4_,~auVar103._0_4_) & 0x7f8000007f800000;
                        auVar132._8_4_ = ~auVar103._8_4_ & 0x7f800000;
                        auVar132._12_4_ = ~auVar103._12_4_ & 0x7f800000;
                        auVar132 = auVar132 | auVar173;
                        auVar174._4_4_ = auVar132._0_4_;
                        auVar174._0_4_ = auVar132._4_4_;
                        auVar174._8_4_ = auVar132._12_4_;
                        auVar174._12_4_ = auVar132._8_4_;
                        auVar124 = minps(auVar174,auVar132);
                        auVar104._0_8_ = auVar124._8_8_;
                        auVar104._8_4_ = auVar124._0_4_;
                        auVar104._12_4_ = auVar124._4_4_;
                        auVar124 = minps(auVar104,auVar124);
                        auVar105._0_8_ =
                             CONCAT44(-(uint)(auVar124._4_4_ == auVar132._4_4_) & auVar103._4_4_,
                                      -(uint)(auVar124._0_4_ == auVar132._0_4_) & auVar103._0_4_);
                        auVar105._8_4_ = -(uint)(auVar124._8_4_ == auVar132._8_4_) & auVar103._8_4_;
                        auVar105._12_4_ =
                             -(uint)(auVar124._12_4_ == auVar132._12_4_) & auVar103._12_4_;
                        iVar65 = movmskps(uVar81,auVar105);
                        if (iVar65 != 0) {
                          auVar103._8_4_ = auVar105._8_4_;
                          auVar103._0_8_ = auVar105._0_8_;
                          auVar103._12_4_ = auVar105._12_4_;
                        }
                        uVar81 = movmskps(iVar65,auVar103);
                        lVar62 = 0;
                        if (uVar81 != 0) {
                          for (; (uVar81 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                          }
                        }
                        pRVar73 = context->args;
                        if ((pRVar73->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar72->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar179 = local_11a8[lVar62];
                          fVar123 = local_1198[lVar62];
                          fVar144 = *(float *)((long)&local_1178 + lVar62 * 4);
                          fVar232 = local_1168[lVar62];
                          fVar140 = *(float *)((long)&local_1158 + lVar62 * 4);
                          (ray->super_RayK<1>).tfar = local_1188[lVar62];
                          (ray->Ng).field_0.field_0.x = fVar144;
                          (ray->Ng).field_0.field_0.y = fVar232;
                          (ray->Ng).field_0.field_0.z = fVar140;
                          ray->u = fVar179;
                          ray->v = fVar123;
                          ray->primID = uVar80;
                          ray->geomID = uVar79;
                          pRVar68 = context->user;
                          ray->instID[0] = pRVar68->instID[0];
                          uVar79 = pRVar68->instPrimID[0];
                          ray->instPrimID[0] = uVar79;
                        }
                        else {
                          local_10f8 = context->user;
                          local_1210 = pGVar72;
                          local_1148 = pRVar73;
                          do {
                            local_124c = local_11a8[lVar62];
                            local_1248 = local_1198[lVar62];
                            local_10e8._0_4_ = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1188[lVar62];
                            local_1138 = lVar62;
                            local_1258 = *(float *)((long)&local_1178 + lVar62 * 4);
                            local_1254 = local_1168[lVar62];
                            local_1250 = *(undefined4 *)((long)&local_1158 + lVar62 * 4);
                            local_1244 = uVar80;
                            local_1240 = (int)local_12d4._4_8_;
                            local_123c = local_10f8->instID[0];
                            local_1238 = local_10f8->instPrimID[0];
                            local_12d4._0_4_ = -NAN;
                            local_12b8.valid = (int *)local_12d4;
                            local_12b8.geometryUserPtr = pGVar72->userPtr;
                            local_12b8.context = local_10f8;
                            local_12b8.ray = (RTCRayN *)ray;
                            local_12b8.hit = (RTCHitN *)&local_1258;
                            local_12b8.N = 1;
                            if ((pGVar72->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar72->intersectionFilterN)(&local_12b8), pGVar72 = local_1210,
                               pRVar73 = local_1148,
                               (((RayK<1> *)local_12b8.valid)->org).field_0.m128[0] != 0.0)) {
                              if (pRVar73->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar73->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar72->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar73->filter)(&local_12b8);
                                  pGVar72 = local_1210;
                                }
                                pRVar73 = local_1148;
                                if ((((RayK<1> *)local_12b8.valid)->org).field_0.m128[0] == 0.0)
                                goto LAB_00e0ac68;
                              }
                              (((Vec3f *)((long)local_12b8.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_12b8.hit;
                              *(float *)((long)local_12b8.ray + 0x34) =
                                   *(float *)(local_12b8.hit + 4);
                              *(float *)((long)local_12b8.ray + 0x38) =
                                   *(float *)(local_12b8.hit + 8);
                              *(float *)((long)local_12b8.ray + 0x3c) =
                                   *(float *)(local_12b8.hit + 0xc);
                              *(float *)((long)local_12b8.ray + 0x40) =
                                   *(float *)(local_12b8.hit + 0x10);
                              *(float *)((long)local_12b8.ray + 0x44) =
                                   *(float *)(local_12b8.hit + 0x14);
                              *(float *)((long)local_12b8.ray + 0x48) =
                                   *(float *)(local_12b8.hit + 0x18);
                              *(float *)((long)local_12b8.ray + 0x4c) =
                                   *(float *)(local_12b8.hit + 0x1c);
                              *(float *)((long)local_12b8.ray + 0x50) =
                                   *(float *)(local_12b8.hit + 0x20);
                              pRVar64 = (RayHit *)local_12b8.ray;
                            }
                            else {
LAB_00e0ac68:
                              (ray->super_RayK<1>).tfar = (float)local_10e8._0_4_;
                              pRVar64 = (RayHit *)local_12b8.valid;
                              pRVar73 = local_1148;
                            }
                            lVar62 = local_1138;
                            *(undefined4 *)(auStack_12c4 + local_1138 * 4 + -4) = 0;
                            fVar179 = (ray->super_RayK<1>).tfar;
                            auVar108._0_4_ = -(uint)(local_1188[0] <= fVar179) & local_12d4._12_4_;
                            auVar108._4_4_ = -(uint)(local_1188[1] <= fVar179) & auStack_12c4._0_4_;
                            auVar108._8_4_ = -(uint)(local_1188[2] <= fVar179) & auStack_12c4._4_4_;
                            auVar108._12_4_ = -(uint)(local_1188[3] <= fVar179) & auStack_12c4._8_4_
                            ;
                            stack0xffffffffffffed38 = auVar108;
                            uVar79 = movmskps((int)pRVar64,auVar108);
                            if (uVar79 != 0) {
                              auVar134._0_4_ = (uint)local_1188[0] & auVar108._0_4_;
                              auVar134._4_4_ = (uint)local_1188[1] & auVar108._4_4_;
                              auVar134._8_4_ = (uint)local_1188[2] & auVar108._8_4_;
                              auVar134._12_4_ = (uint)local_1188[3] & auVar108._12_4_;
                              auVar154._0_8_ =
                                   CONCAT44(~auVar108._4_4_,~auVar108._0_4_) & 0x7f8000007f800000;
                              auVar154._8_4_ = ~auVar108._8_4_ & 0x7f800000;
                              auVar154._12_4_ = ~auVar108._12_4_ & 0x7f800000;
                              auVar154 = auVar154 | auVar134;
                              auVar177._4_4_ = auVar154._0_4_;
                              auVar177._0_4_ = auVar154._4_4_;
                              auVar177._8_4_ = auVar154._12_4_;
                              auVar177._12_4_ = auVar154._8_4_;
                              auVar124 = minps(auVar177,auVar154);
                              auVar135._0_8_ = auVar124._8_8_;
                              auVar135._8_4_ = auVar124._0_4_;
                              auVar135._12_4_ = auVar124._4_4_;
                              auVar124 = minps(auVar135,auVar124);
                              auVar136._0_8_ =
                                   CONCAT44(-(uint)(auVar124._4_4_ == auVar154._4_4_) &
                                            auVar108._4_4_,
                                            -(uint)(auVar124._0_4_ == auVar154._0_4_) &
                                            auVar108._0_4_);
                              auVar136._8_4_ =
                                   -(uint)(auVar124._8_4_ == auVar154._8_4_) & auVar108._8_4_;
                              auVar136._12_4_ =
                                   -(uint)(auVar124._12_4_ == auVar154._12_4_) & auVar108._12_4_;
                              iVar65 = movmskps((int)lVar62,auVar136);
                              if (iVar65 != 0) {
                                auVar108._8_4_ = auVar136._8_4_;
                                auVar108._0_8_ = auVar136._0_8_;
                                auVar108._12_4_ = auVar136._12_4_;
                              }
                              uVar61 = movmskps(iVar65,auVar108);
                              uVar67 = CONCAT44((int)((ulong)lVar62 >> 0x20),uVar61);
                              lVar62 = 0;
                              if (uVar67 != 0) {
                                for (; (uVar67 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                                }
                              }
                            }
                          } while ((char)uVar79 != '\0');
                        }
                        pSVar63 = (Scene *)(ulong)uVar79;
                        fVar206 = (float)local_fb8;
                        fVar211 = local_fb8._4_4_;
                      }
                    }
                  }
                  local_10d8._0_4_ = (float)local_1288._0_4_ - (float)local_10d8;
                  local_10d8._4_4_ = (float)local_1288._4_4_ - local_10d8._4_4_;
                  fStack_10d0 = fStack_1280 - fStack_10d0;
                  fStack_10cc = fStack_127c - fStack_10cc;
                  local_10c8 = local_1268 - local_10c8;
                  fStack_10c4 = fStack_1264 - fStack_10c4;
                  fStack_10c0 = fStack_1260 - fStack_10c0;
                  fStack_10bc = fStack_125c - fStack_10bc;
                  fVar206 = (float)local_1278 - fVar206;
                  fVar211 = local_1278._4_4_ - fVar211;
                  fVar158 = fStack_1270 - fStack_fb0;
                  fVar160 = fStack_126c - fStack_fac;
                  fVar121 = (float)local_1228 - (float)local_1288._0_4_;
                  fVar122 = local_1228._4_4_ - (float)local_1288._4_4_;
                  fVar142 = fStack_1220 - fStack_1280;
                  fVar156 = fStack_121c - fStack_127c;
                  fVar216 = local_f98 - local_1268;
                  fVar217 = fStack_f94 - fStack_1264;
                  fVar219 = fStack_f90 - fStack_1260;
                  fVar220 = fStack_f8c - fStack_125c;
                  fVar192 = local_fa8 - (float)local_1278;
                  fVar193 = fStack_fa4 - local_1278._4_4_;
                  fVar200 = fStack_fa0 - fStack_1270;
                  fVar203 = fStack_f9c - fStack_126c;
                  fVar221 = fVar216 * fVar206 - fVar192 * local_10c8;
                  fVar222 = fVar217 * fVar211 - fVar193 * fStack_10c4;
                  fVar223 = fVar219 * fVar158 - fVar200 * fStack_10c0;
                  fVar224 = fVar220 * fVar160 - fVar203 * fStack_10bc;
                  local_1168[0] = fVar192 * (float)local_10d8 - fVar121 * fVar206;
                  local_1168[1] = fVar193 * local_10d8._4_4_ - fVar122 * fVar211;
                  local_1168[2] = fVar200 * fStack_10d0 - fVar142 * fVar158;
                  local_1168[3] = fVar203 * fStack_10cc - fVar156 * fVar160;
                  fVar159 = fVar121 * local_10c8 - fVar216 * (float)local_10d8;
                  fVar194 = fVar122 * fStack_10c4 - fVar217 * local_10d8._4_4_;
                  fStack_1220 = fVar142 * fStack_10c0 - fVar219 * fStack_10d0;
                  fStack_121c = fVar156 * fStack_10bc - fVar220 * fStack_10cc;
                  fVar179 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar123 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar144 = (ray->super_RayK<1>).org.field_0.m128[2];
                  fVar232 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fVar140 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  fVar233 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1288._0_4_ = (uint)(local_1288._0_4_ - fVar179);
                  local_1288._4_4_ = (uint)(local_1288._4_4_ - fVar179);
                  fStack_1280 = fStack_1280 - fVar179;
                  fStack_127c = fStack_127c - fVar179;
                  local_1268 = local_1268 - fVar123;
                  fStack_1264 = fStack_1264 - fVar123;
                  fStack_1260 = fStack_1260 - fVar123;
                  fStack_125c = fStack_125c - fVar123;
                  local_1278._0_4_ = (float)local_1278 - fVar144;
                  local_1278._4_4_ = local_1278._4_4_ - fVar144;
                  fStack_1270 = fStack_1270 - fVar144;
                  fStack_126c = fStack_126c - fVar144;
                  fVar201 = local_1268 * fVar233 - (float)local_1278 * fVar140;
                  fVar204 = fStack_1264 * fVar233 - local_1278._4_4_ * fVar140;
                  fVar85 = fStack_1260 * fVar233 - fStack_1270 * fVar140;
                  fVar116 = fStack_125c * fVar233 - fStack_126c * fVar140;
                  fVar179 = (float)local_1278 * fVar232 - (float)local_1288._0_4_ * fVar233;
                  fVar123 = local_1278._4_4_ * fVar232 - (float)local_1288._4_4_ * fVar233;
                  fVar144 = fStack_1270 * fVar232 - fStack_1280 * fVar233;
                  fVar143 = fStack_126c * fVar232 - fStack_127c * fVar233;
                  fVar205 = (float)local_1288._0_4_ * fVar140 - local_1268 * fVar232;
                  fVar213 = (float)local_1288._4_4_ * fVar140 - fStack_1264 * fVar232;
                  fVar214 = fStack_1280 * fVar140 - fStack_1260 * fVar232;
                  fVar215 = fStack_127c * fVar140 - fStack_125c * fVar232;
                  local_1228 = CONCAT44(fVar194,fVar159);
                  fVar180 = fVar232 * fVar221 + fVar140 * local_1168[0] + fVar233 * fVar159;
                  fVar183 = fVar232 * fVar222 + fVar140 * local_1168[1] + fVar233 * fVar194;
                  fVar185 = fVar232 * fVar223 + fVar140 * local_1168[2] + fVar233 * fStack_1220;
                  fVar187 = fVar232 * fVar224 + fVar140 * local_1168[3] + fVar233 * fStack_121c;
                  uVar79 = (uint)fVar180 & 0x80000000;
                  uVar81 = (uint)fVar183 & 0x80000000;
                  uVar82 = (uint)fVar185 & 0x80000000;
                  uVar184 = (uint)fVar187 & 0x80000000;
                  fVar121 = (float)((uint)(fVar121 * fVar201 + fVar216 * fVar179 + fVar192 * fVar205
                                          ) ^ uVar79);
                  fVar122 = (float)((uint)(fVar122 * fVar204 + fVar217 * fVar123 + fVar193 * fVar213
                                          ) ^ uVar81);
                  fVar142 = (float)((uint)(fVar142 * fVar85 + fVar219 * fVar144 + fVar200 * fVar214)
                                   ^ uVar82);
                  fVar156 = (float)((uint)(fVar156 * fVar116 + fVar220 * fVar143 + fVar203 * fVar215
                                          ) ^ uVar184);
                  fVar232 = (float)((uint)(fVar201 * (float)local_10d8 +
                                          fVar179 * local_10c8 + fVar205 * fVar206) ^ uVar79);
                  fVar140 = (float)((uint)(fVar204 * local_10d8._4_4_ +
                                          fVar123 * fStack_10c4 + fVar213 * fVar211) ^ uVar81);
                  fVar144 = (float)((uint)(fVar85 * fStack_10d0 +
                                          fVar144 * fStack_10c0 + fVar214 * fVar158) ^ uVar82);
                  fVar233 = (float)((uint)(fVar116 * fStack_10cc +
                                          fVar143 * fStack_10bc + fVar215 * fVar160) ^ uVar184);
                  fVar179 = ABS(fVar180);
                  fVar123 = ABS(fVar183);
                  local_11d8._0_8_ = CONCAT44(fVar183,fVar180) & 0x7fffffff7fffffff;
                  local_11d8._8_4_ = ABS(fVar185);
                  local_11d8._12_4_ = ABS(fVar187);
                  auVar210._0_4_ =
                       -(uint)((0.0 <= fVar121 && 0.0 <= fVar232) && fVar180 != 0.0) & local_1128 &
                       -(uint)(fVar121 + fVar232 <= fVar179);
                  auVar210._4_4_ =
                       -(uint)((0.0 <= fVar122 && 0.0 <= fVar140) && fVar183 != 0.0) & uStack_1124 &
                       -(uint)(fVar122 + fVar140 <= fVar123);
                  auVar210._8_4_ =
                       -(uint)((0.0 <= fVar142 && 0.0 <= fVar144) && fVar185 != 0.0) & uStack_1120 &
                       -(uint)(fVar142 + fVar144 <= local_11d8._8_4_);
                  auVar210._12_4_ =
                       -(uint)((0.0 <= fVar156 && 0.0 <= fVar233) && fVar187 != 0.0) & uStack_111c &
                       -(uint)(fVar156 + fVar233 <= local_11d8._12_4_);
                  iVar65 = movmskps((int)pSVar63,auVar210);
                  if (iVar65 != 0) {
                    local_11e8._0_4_ =
                         uVar79 ^ (uint)((float)local_1288._0_4_ * fVar221 +
                                        local_1268 * local_1168[0] + (float)local_1278 * fVar159);
                    local_11e8._4_4_ =
                         uVar81 ^ (uint)((float)local_1288._4_4_ * fVar222 +
                                        fStack_1264 * local_1168[1] + local_1278._4_4_ * fVar194);
                    fStack_11e0 = (float)(uVar82 ^ (uint)(fStack_1280 * fVar223 +
                                                         fStack_1260 * local_1168[2] +
                                                         fStack_1270 * fStack_1220));
                    fStack_11dc = (float)(uVar184 ^
                                         (uint)(fStack_127c * fVar224 +
                                               fStack_125c * local_1168[3] +
                                               fStack_126c * fStack_121c));
                    fVar143 = (ray->super_RayK<1>).org.field_0.m128[3];
                    fVar159 = (ray->super_RayK<1>).tfar;
                    auVar153._0_4_ =
                         -(uint)((float)local_11e8._0_4_ <= fVar159 * fVar179 &&
                                fVar143 * fVar179 < (float)local_11e8._0_4_) & auVar210._0_4_;
                    auVar153._4_4_ =
                         -(uint)((float)local_11e8._4_4_ <= fVar159 * fVar123 &&
                                fVar143 * fVar123 < (float)local_11e8._4_4_) & auVar210._4_4_;
                    auVar153._8_4_ =
                         -(uint)(fStack_11e0 <= fVar159 * local_11d8._8_4_ &&
                                fVar143 * local_11d8._8_4_ < fStack_11e0) & auVar210._8_4_;
                    auVar153._12_4_ =
                         -(uint)(fStack_11dc <= fVar159 * local_11d8._12_4_ &&
                                fVar143 * local_11d8._12_4_ < fStack_11dc) & auVar210._12_4_;
                    iVar65 = movmskps(iVar65,auVar153);
                    if (iVar65 != 0) {
                      local_11b8 = auVar153;
                      local_1178 = CONCAT44(fVar222,fVar221);
                      uStack_1170 = CONCAT44(fVar224,fVar223);
                      local_1158 = local_1228;
                      uStack_1150 = CONCAT44(fStack_121c,fStack_1220);
                      fVar143 = (float)(int)(*(ushort *)(lVar9 + 8 + lVar71) - 1);
                      auVar124 = rcpss(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143));
                      fStack_11fc = (2.0 - fVar143 * auVar124._0_4_) * auVar124._0_4_;
                      fVar143 = (float)(int)(*(ushort *)(lVar9 + 10 + lVar71) - 1);
                      auVar124 = rcpss(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143));
                      fVar143 = (2.0 - fVar143 * auVar124._0_4_) * auVar124._0_4_;
                      local_1208._0_4_ =
                           fStack_11fc *
                           ((float)(int)local_fc8._0_4_ * fVar179 + (fVar179 - fVar121));
                      local_1208._4_4_ =
                           fStack_11fc *
                           ((float)(local_fc8._0_4_ + 1) * fVar123 + (fVar123 - fVar122));
                      fStack_1200 = fStack_11fc *
                                    ((float)(local_fc8._0_4_ + 1) * local_11d8._8_4_ +
                                    (local_11d8._8_4_ - fVar142));
                      fStack_11fc = fStack_11fc *
                                    ((float)(int)local_fc8._0_4_ * local_11d8._12_4_ +
                                    (local_11d8._12_4_ - fVar156));
                      auVar191._0_4_ = (float)(int)local_fc8._4_4_ * fVar179 + (fVar179 - fVar232);
                      auVar191._4_4_ = (float)(int)local_fc8._4_4_ * fVar123 + (fVar123 - fVar140);
                      auVar191._8_4_ =
                           (float)(local_fc8._4_4_ + 1) * local_11d8._8_4_ +
                           (local_11d8._8_4_ - fVar144);
                      auVar191._12_4_ =
                           (float)(local_fc8._4_4_ + 1) * local_11d8._12_4_ +
                           (local_11d8._12_4_ - fVar233);
                      fStack_11f4 = fVar143 * auVar191._4_4_;
                      local_11f8 = fVar143 * auVar191._0_4_;
                      fStack_11f0 = fVar143 * auVar191._8_4_;
                      fStack_11ec = fVar143 * auVar191._12_4_;
                      pGVar72 = (context->scene->geometries).items[local_12d4._4_8_].ptr;
                      uVar79 = (ray->super_RayK<1>).mask;
                      if ((pGVar72->mask & uVar79) != 0) {
                        stack0xffffffffffffed38 = auVar153;
                        auVar124 = rcpps(auVar191,local_11d8);
                        fVar144 = auVar124._0_4_;
                        fVar232 = auVar124._4_4_;
                        fVar140 = auVar124._8_4_;
                        fVar233 = auVar124._12_4_;
                        fVar144 = (1.0 - fVar179 * fVar144) * fVar144 + fVar144;
                        fVar232 = (1.0 - fVar123 * fVar232) * fVar232 + fVar232;
                        fVar140 = (1.0 - local_11d8._8_4_ * fVar140) * fVar140 + fVar140;
                        fVar233 = (1.0 - local_11d8._12_4_ * fVar233) * fVar233 + fVar233;
                        local_1188[0] = (float)local_11e8._0_4_ * fVar144;
                        local_1188[1] = (float)local_11e8._4_4_ * fVar232;
                        local_1188[2] = fStack_11e0 * fVar140;
                        local_1188[3] = fStack_11dc * fVar233;
                        local_11a8[0] = (float)local_1208._0_4_ * fVar144;
                        local_11a8[1] = (float)local_1208._4_4_ * fVar232;
                        local_11a8[2] = fStack_1200 * fVar140;
                        local_11a8[3] = fStack_11fc * fVar233;
                        local_1198[0] = fVar143 * auVar191._0_4_ * fVar144;
                        local_1198[1] = fVar143 * auVar191._4_4_ * fVar232;
                        local_1198[2] = fVar143 * auVar191._8_4_ * fVar140;
                        local_1198[3] = fVar143 * auVar191._12_4_ * fVar233;
                        auVar175._0_4_ = (uint)((float)local_11e8._0_4_ * fVar144) & auVar153._0_4_;
                        auVar175._4_4_ = (uint)((float)local_11e8._4_4_ * fVar232) & auVar153._4_4_;
                        auVar175._8_4_ = (uint)(fStack_11e0 * fVar140) & auVar153._8_4_;
                        auVar175._12_4_ = (uint)(fStack_11dc * fVar233) & auVar153._12_4_;
                        auVar133._0_8_ =
                             CONCAT44(~auVar153._4_4_,~auVar153._0_4_) & 0x7f8000007f800000;
                        auVar133._8_4_ = ~auVar153._8_4_ & 0x7f800000;
                        auVar133._12_4_ = ~auVar153._12_4_ & 0x7f800000;
                        auVar133 = auVar133 | auVar175;
                        auVar176._4_4_ = auVar133._0_4_;
                        auVar176._0_4_ = auVar133._4_4_;
                        auVar176._8_4_ = auVar133._12_4_;
                        auVar176._12_4_ = auVar133._8_4_;
                        auVar124 = minps(auVar176,auVar133);
                        auVar106._0_8_ = auVar124._8_8_;
                        auVar106._8_4_ = auVar124._0_4_;
                        auVar106._12_4_ = auVar124._4_4_;
                        auVar124 = minps(auVar106,auVar124);
                        auVar107._0_8_ =
                             CONCAT44(-(uint)(auVar124._4_4_ == auVar133._4_4_) & auVar153._4_4_,
                                      -(uint)(auVar124._0_4_ == auVar133._0_4_) & auVar153._0_4_);
                        auVar107._8_4_ = -(uint)(auVar124._8_4_ == auVar133._8_4_) & auVar153._8_4_;
                        auVar107._12_4_ =
                             -(uint)(auVar124._12_4_ == auVar133._12_4_) & auVar153._12_4_;
                        iVar65 = movmskps(uVar79,auVar107);
                        if (iVar65 != 0) {
                          auVar153._8_4_ = auVar107._8_4_;
                          auVar153._0_8_ = auVar107._0_8_;
                          auVar153._12_4_ = auVar107._12_4_;
                        }
                        uVar79 = movmskps(iVar65,auVar153);
                        lVar62 = 0;
                        if (uVar79 != 0) {
                          for (; (uVar79 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                          }
                        }
                        pRVar73 = context->args;
                        if ((pRVar73->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar72->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar179 = local_11a8[lVar62];
                          fVar123 = local_1198[lVar62];
                          fVar144 = *(float *)((long)&local_1178 + lVar62 * 4);
                          fVar232 = local_1168[lVar62];
                          fVar140 = *(float *)((long)&local_1158 + lVar62 * 4);
                          (ray->super_RayK<1>).tfar = local_1188[lVar62];
                          (ray->Ng).field_0.field_0.x = fVar144;
                          (ray->Ng).field_0.field_0.y = fVar232;
                          (ray->Ng).field_0.field_0.z = fVar140;
                          ray->u = fVar179;
                          ray->v = fVar123;
                          ray->primID = uVar80;
                          ray->geomID = (uint)local_12d4._4_8_;
                          pRVar68 = context->user;
                          ray->instID[0] = pRVar68->instID[0];
                          ray->instPrimID[0] = pRVar68->instPrimID[0];
                        }
                        else {
                          local_1288 = context->user;
                          local_1278 = pRVar73;
                          do {
                            local_124c = local_11a8[lVar62];
                            local_1248 = local_1198[lVar62];
                            local_1268 = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1188[lVar62];
                            local_1258 = *(float *)((long)&local_1178 + lVar62 * 4);
                            local_1254 = local_1168[lVar62];
                            local_1250 = *(undefined4 *)((long)&local_1158 + lVar62 * 4);
                            local_1244 = uVar80;
                            local_1240 = (int)local_12d4._4_8_;
                            local_123c = local_1288->instID[0];
                            local_1238 = local_1288->instPrimID[0];
                            local_12d4._0_4_ = -NAN;
                            local_12b8.valid = (int *)local_12d4;
                            local_12b8.geometryUserPtr = pGVar72->userPtr;
                            local_12b8.context = local_1288;
                            local_12b8.ray = (RTCRayN *)ray;
                            local_12b8.hit = (RTCHitN *)&local_1258;
                            local_12b8.N = 1;
                            pRVar68 = local_1288;
                            if ((pGVar72->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar72->intersectionFilterN)(&local_12b8), pRVar73 = local_1278,
                               (((RayK<1> *)local_12b8.valid)->org).field_0.m128[0] != 0.0)) {
                              if (pRVar73->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar73->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar72->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar73->filter)(&local_12b8);
                                }
                                pRVar73 = local_1278;
                                if ((((RayK<1> *)local_12b8.valid)->org).field_0.m128[0] == 0.0)
                                goto LAB_00e0aeb9;
                              }
                              (((Vec3f *)((long)local_12b8.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_12b8.hit;
                              *(float *)((long)local_12b8.ray + 0x34) =
                                   *(float *)(local_12b8.hit + 4);
                              *(float *)((long)local_12b8.ray + 0x38) =
                                   *(float *)(local_12b8.hit + 8);
                              *(float *)((long)local_12b8.ray + 0x3c) =
                                   *(float *)(local_12b8.hit + 0xc);
                              *(float *)((long)local_12b8.ray + 0x40) =
                                   *(float *)(local_12b8.hit + 0x10);
                              *(float *)((long)local_12b8.ray + 0x44) =
                                   *(float *)(local_12b8.hit + 0x14);
                              *(float *)((long)local_12b8.ray + 0x48) =
                                   *(float *)(local_12b8.hit + 0x18);
                              *(float *)((long)local_12b8.ray + 0x4c) =
                                   *(float *)(local_12b8.hit + 0x1c);
                              pRVar68 = (RTCRayQueryContext *)
                                        (ulong)(uint)*(float *)(local_12b8.hit + 0x20);
                              *(float *)((long)local_12b8.ray + 0x50) =
                                   *(float *)(local_12b8.hit + 0x20);
                              pRVar64 = (RayHit *)local_12b8.ray;
                            }
                            else {
LAB_00e0aeb9:
                              (ray->super_RayK<1>).tfar = local_1268;
                              pRVar64 = (RayHit *)local_12b8.valid;
                              pRVar73 = local_1278;
                            }
                            *(undefined4 *)(auStack_12c4 + lVar62 * 4 + -4) = 0;
                            fVar179 = (ray->super_RayK<1>).tfar;
                            auVar109._0_4_ = -(uint)(local_1188[0] <= fVar179) & local_12d4._12_4_;
                            auVar109._4_4_ = -(uint)(local_1188[1] <= fVar179) & auStack_12c4._0_4_;
                            auVar109._8_4_ = -(uint)(local_1188[2] <= fVar179) & auStack_12c4._4_4_;
                            auVar109._12_4_ = -(uint)(local_1188[3] <= fVar179) & auStack_12c4._8_4_
                            ;
                            stack0xffffffffffffed38 = auVar109;
                            iVar65 = movmskps((int)pRVar64,auVar109);
                            if (iVar65 != 0) {
                              auVar137._0_4_ = (uint)local_1188[0] & auVar109._0_4_;
                              auVar137._4_4_ = (uint)local_1188[1] & auVar109._4_4_;
                              auVar137._8_4_ = (uint)local_1188[2] & auVar109._8_4_;
                              auVar137._12_4_ = (uint)local_1188[3] & auVar109._12_4_;
                              auVar155._0_8_ =
                                   CONCAT44(~auVar109._4_4_,~auVar109._0_4_) & 0x7f8000007f800000;
                              auVar155._8_4_ = ~auVar109._8_4_ & 0x7f800000;
                              auVar155._12_4_ = ~auVar109._12_4_ & 0x7f800000;
                              auVar155 = auVar155 | auVar137;
                              auVar178._4_4_ = auVar155._0_4_;
                              auVar178._0_4_ = auVar155._4_4_;
                              auVar178._8_4_ = auVar155._12_4_;
                              auVar178._12_4_ = auVar155._8_4_;
                              auVar124 = minps(auVar178,auVar155);
                              auVar138._0_8_ = auVar124._8_8_;
                              auVar138._8_4_ = auVar124._0_4_;
                              auVar138._12_4_ = auVar124._4_4_;
                              auVar124 = minps(auVar138,auVar124);
                              auVar139._0_8_ =
                                   CONCAT44(-(uint)(auVar124._4_4_ == auVar155._4_4_) &
                                            auVar109._4_4_,
                                            -(uint)(auVar124._0_4_ == auVar155._0_4_) &
                                            auVar109._0_4_);
                              auVar139._8_4_ =
                                   -(uint)(auVar124._8_4_ == auVar155._8_4_) & auVar109._8_4_;
                              auVar139._12_4_ =
                                   -(uint)(auVar124._12_4_ == auVar155._12_4_) & auVar109._12_4_;
                              iVar66 = movmskps((int)pRVar68,auVar139);
                              if (iVar66 != 0) {
                                auVar109._8_4_ = auVar139._8_4_;
                                auVar109._0_8_ = auVar139._0_8_;
                                auVar109._12_4_ = auVar139._12_4_;
                              }
                              uVar61 = movmskps(iVar66,auVar109);
                              uVar67 = CONCAT44((int)((ulong)pRVar68 >> 0x20),uVar61);
                              lVar62 = 0;
                              if (uVar67 != 0) {
                                for (; (uVar67 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                                }
                              }
                            }
                          } while ((char)iVar65 != '\0');
                        }
                      }
                    }
                  }
                }
                uVar77 = uVar77 & uVar77 - 1;
              } while (uVar77 != 0);
            }
            local_1038 = local_1038 + 1;
          } while (local_1038 != local_1050);
        }
        local_1108._4_4_ = (ray->super_RayK<1>).tfar;
        local_1108._0_4_ = local_1108._4_4_;
        fStack_1100 = (float)local_1108._4_4_;
        fStack_10fc = (float)local_1108._4_4_;
        uVar77 = local_10a0;
        uVar67 = local_1098;
        uVar74 = local_10b0;
        uVar78 = local_10a8;
        auVar124 = local_1028;
        fVar179 = local_1118;
        fVar123 = fStack_1114;
        fVar144 = fStack_1110;
        fVar232 = fStack_110c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }